

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,uint *key)

{
  int iVar1;
  int *piVar2;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_> *pSVar3;
  bool bVar4;
  undefined8 in_RAX;
  uint depth;
  uint unaff_R13D;
  uint uVar5;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  piVar2 = (this->buckets).ptr;
  depth = 0;
  if (piVar2 == (int *)0x0) {
    uVar5 = 0;
  }
  else {
    local_34 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar5 = piVar2[local_34];
    if (-1 < (long)(int)uVar5) {
      pSVar3 = (this->entries).ptr;
      if (pSVar3[(int)uVar5].
          super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
          super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
          .
          super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
          .key == *key) {
        depth = 0;
        unaff_R13D = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          unaff_R13D = uVar5;
          depth = depth + 1;
          uVar5 = pSVar3[unaff_R13D].
                  super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
                  .
                  super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                  .next;
          if ((long)(int)uVar5 < 0) goto LAB_00b0eacd;
        } while (pSVar3[(int)uVar5].
                 super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .
                 super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                 .
                 super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
                 .
                 super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                 .key != *key);
      }
      bVar4 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_00b0eae1;
    }
    unaff_R13D = 0xffffffff;
  }
LAB_00b0eacd:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar4 = false;
LAB_00b0eae1:
  if (bVar4) {
    pSVar3 = (this->entries).ptr;
    iVar1 = pSVar3[(int)uVar5].
            super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
            super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
            .
            super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
            .next;
    if ((int)unaff_R13D < 0) {
      (this->buckets).ptr[local_34] = iVar1;
    }
    else {
      pSVar3[unaff_R13D].
      super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
      super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
      .next = iVar1;
    }
    pSVar3 = (this->entries).ptr;
    Memory::Recycler::WBSetBit((char *)(pSVar3 + (int)uVar5));
    pSVar3[(int)uVar5].
    super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
    super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
    value.ptr = (DynamicProfileInfo *)0x0;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar3 + (int)uVar5);
    pSVar3[(int)uVar5].
    super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
    super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
    key = 0;
    SetNextFreeEntryIndex
              (this,(this->entries).ptr + (int)uVar5,-(uint)(this->freeCount == 0) | this->freeList)
    ;
    this->freeList = uVar5;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,(this->buckets).ptr[local_34] == -1);
    }
  }
  return bVar4;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }